

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O1

void boost::filesystem::path::m_path_iterator_increment(iterator *it)

{
  char cVar1;
  string_type *str;
  ulong uVar2;
  char *pcVar3;
  pointer pcVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  long *local_30 [2];
  long local_20 [2];
  
  str = &it->m_path_ptr->m_pathname;
  uVar2 = str->_M_string_length;
  if (uVar2 <= it->m_pos) {
    __assert_fail("(it.m_pos < it.m_path_ptr->m_pathname.size())&&(\"path::basic_iterator increment past end()\")"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Naios[P]boost-minimal-dist/libs/filesystem/src/path.cpp"
                  ,0x2f8,
                  "static void boost::filesystem::path::m_path_iterator_increment(path::iterator &)"
                 );
  }
  uVar6 = (it->m_element).m_pathname._M_string_length;
  uVar5 = it->m_pos + uVar6;
  it->m_pos = uVar5;
  if (uVar5 == uVar2) {
    (it->m_element).m_pathname._M_string_length = 0;
    *(it->m_element).m_pathname._M_dataplus._M_p = '\0';
    return;
  }
  if (((uVar6 < 3) || (pcVar3 = (it->m_element).m_pathname._M_dataplus._M_p, *pcVar3 != '/')) ||
     (pcVar3[1] != '/')) {
    bVar7 = false;
  }
  else {
    bVar7 = pcVar3[2] != '/';
  }
  pcVar4 = (str->_M_dataplus)._M_p;
  if (pcVar4[uVar5] == '/') {
    if (bVar7) {
      std::__cxx11::string::_M_replace_aux((ulong)it,0,uVar6,'\x01');
      return;
    }
    uVar6 = it->m_pos;
    bVar7 = uVar6 == uVar2;
    uVar5 = uVar6;
    if (!bVar7) {
      cVar1 = pcVar4[uVar6];
      while (cVar1 == '/') {
        uVar6 = uVar6 + 1;
        it->m_pos = uVar6;
        bVar7 = uVar2 == uVar6;
        uVar5 = uVar2;
        if (bVar7) goto LAB_00110828;
        cVar1 = pcVar4[uVar6];
      }
      uVar5 = uVar6;
      if (!bVar7) goto LAB_00110834;
    }
LAB_00110828:
    bVar7 = anon_unknown.dwarf_1dc47::is_root_separator(str,uVar5 - 1);
    if (!bVar7) {
      it->m_pos = it->m_pos - 1;
      detail::dot_path();
      std::__cxx11::string::_M_assign((string *)it);
      return;
    }
  }
LAB_00110834:
  std::__cxx11::string::find_first_of((char *)it->m_path_ptr,0x114024,it->m_pos);
  std::__cxx11::string::substr((ulong)local_30,(ulong)it->m_path_ptr);
  std::__cxx11::string::_M_assign((string *)it);
  if (local_30[0] != local_20) {
    operator_delete(local_30[0],local_20[0] + 1);
  }
  return;
}

Assistant:

void path::m_path_iterator_increment(path::iterator & it)
  {
    BOOST_ASSERT_MSG(it.m_pos < it.m_path_ptr->m_pathname.size(),
      "path::basic_iterator increment past end()");

    // increment to position past current element; if current element is implicit dot,
    // this will cause it.m_pos to represent the end iterator
    it.m_pos += it.m_element.m_pathname.size();

    // if the end is reached, we are done
    if (it.m_pos == it.m_path_ptr->m_pathname.size())
    {
      it.m_element.clear();  // aids debugging, may release unneeded memory
      return;
    }

    // both POSIX and Windows treat paths that begin with exactly two separators specially
    bool was_net(it.m_element.m_pathname.size() > 2
      && is_separator(it.m_element.m_pathname[0])
      && is_separator(it.m_element.m_pathname[1])
      && !is_separator(it.m_element.m_pathname[2]));

    // process separator (Windows drive spec is only case not a separator)
    if (is_separator(it.m_path_ptr->m_pathname[it.m_pos]))
    {
      // detect root directory
      if (was_net
#       ifdef BOOST_WINDOWS_API
        // case "c:/"
        || it.m_element.m_pathname[it.m_element.m_pathname.size()-1] == colon
#       endif
         )
      {
        it.m_element.m_pathname = separator;  // generic format; see docs
        return;
      }

      // skip separators until it.m_pos points to the start of the next element
      while (it.m_pos != it.m_path_ptr->m_pathname.size()
        && is_separator(it.m_path_ptr->m_pathname[it.m_pos]))
        { ++it.m_pos; }

      // detect trailing separator, and treat it as ".", per POSIX spec
      if (it.m_pos == it.m_path_ptr->m_pathname.size()
        && !is_root_separator(it.m_path_ptr->m_pathname, it.m_pos-1)) 
      {
        --it.m_pos;
        it.m_element = detail::dot_path();
        return;
      }
    }

    // get m_element
    size_type end_pos(it.m_path_ptr->m_pathname.find_first_of(separators, it.m_pos));
    if (end_pos == string_type::npos)
      end_pos = it.m_path_ptr->m_pathname.size();
    it.m_element = it.m_path_ptr->m_pathname.substr(it.m_pos, end_pos - it.m_pos);
  }